

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::~cmCTestMultiProcessHandler(cmCTestMultiProcessHandler *this)

{
  cmCTestMultiProcessHandler *this_local;
  
  ~cmCTestMultiProcessHandler(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

cmCTestMultiProcessHandler::~cmCTestMultiProcessHandler()
{
}